

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void ScanPair(ConfigScanner *sc)

{
  char cVar1;
  _Bool _Var2;
  char *pcVar3;
  char *pcVar4;
  
  if (sc != (ConfigScanner *)0x0) {
    pcVar4 = sc->ptr;
    while( true ) {
      if ((*pcVar4 != ' ') && (*pcVar4 != '\t')) break;
      sc->ptr = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
    }
    _Var2 = GetKeyWord(sc);
    if (_Var2) {
      pcVar4 = sc->ptr;
      while( true ) {
        pcVar3 = pcVar4 + 1;
        cVar1 = *pcVar4;
        if ((cVar1 != '\t') && (cVar1 != ' ')) break;
        sc->ptr = pcVar3;
        pcVar4 = pcVar3;
      }
      if (cVar1 == '=') {
        while( true ) {
          sc->ptr = pcVar3;
          if ((*pcVar3 != ' ') && (*pcVar3 != '\t')) break;
          pcVar3 = pcVar3 + 1;
        }
        ScanValue(sc);
        return;
      }
    }
  }
  return;
}

Assistant:

void ScanPair(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	SkipSpace(sc);
	if (!GetKeyWord(sc))
	{
		return;
	}
	SkipSpace(sc);
	if (!GetEQ(sc))
	{
		return;
	}
	SkipSpace(sc);
	if (!ScanValue(sc))
	{
		return;
	}
	return;
}